

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

void __thiscall QtMWidgets::Slider::mouseMoveEvent(Slider *this,QMouseEvent *e)

{
  int iVar1;
  SliderPrivate *pSVar2;
  SliderPrivate *pSVar3;
  socklen_t *in_RCX;
  sockaddr *__addr;
  QPoint local_24;
  int local_1c;
  QMouseEvent *pQStack_18;
  int newPosition;
  QMouseEvent *e_local;
  Slider *this_local;
  
  pQStack_18 = e;
  e_local = (QMouseEvent *)this;
  pSVar2 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(&this->d);
  if (pSVar2->pressedControl == SC_ComboBoxEditField) {
    QEvent::accept((QEvent *)pQStack_18,(int)e,__addr,in_RCX);
    pSVar2 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
             ::operator->(&this->d);
    pSVar3 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
             ::operator->(&this->d);
    local_24 = QMouseEvent::pos(pQStack_18);
    iVar1 = SliderPrivate::pick(pSVar3,&local_24);
    pSVar3 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
             ::operator->(&this->d);
    local_1c = SliderPrivate::pixelPosToRangeValue(pSVar2,iVar1 - pSVar3->clickOffset);
    QAbstractSlider::setSliderPosition((int)this);
  }
  else {
    QEvent::ignore((QEvent *)pQStack_18);
  }
  return;
}

Assistant:

void
Slider::mouseMoveEvent( QMouseEvent * e )
{
	if( d->pressedControl != QStyle::SC_SliderHandle )
	{
		e->ignore();
		return;
	}

	e->accept();

	const int newPosition = d->pixelPosToRangeValue(
		d->pick( e->pos() ) - d->clickOffset );

	setSliderPosition( newPosition );
}